

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::Type::ByteSizeLong(Type *this)

{
  Rep *pRVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Type *pTVar7;
  size_t sVar8;
  ulong uVar9;
  uint index;
  void **ppvVar10;
  int n;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar12 = (long)(this->fields_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if (lVar12 != 0) {
    lVar13 = lVar12 * 8;
    lVar11 = 0;
    do {
      sVar6 = Field::ByteSizeLong(*(Field **)((long)ppvVar10 + lVar11));
      uVar4 = (uint)sVar6 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + sVar6 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar11 = lVar11 + 8;
    } while (lVar13 - lVar11 != 0);
  }
  uVar4 = (this->oneofs_).super_RepeatedPtrFieldBase.current_size_;
  lVar12 = lVar12 + (ulong)uVar4;
  if (0 < (int)uVar4) {
    index = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->oneofs_).super_RepeatedPtrFieldBase,index);
      uVar5 = (uint)pTVar7->_M_string_length | 1;
      iVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      lVar12 = lVar12 + pTVar7->_M_string_length + (ulong)(iVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  lVar13 = (long)(this->options_).super_RepeatedPtrFieldBase.current_size_;
  sVar6 = lVar12 + lVar13;
  pRVar1 = (this->options_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if (lVar13 != 0) {
    lVar12 = 0;
    do {
      sVar8 = Option::ByteSizeLong(*(Option **)((long)ppvVar10 + lVar12));
      uVar4 = (uint)sVar8 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar8 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar12 = lVar12 + 8;
    } while (lVar13 * 8 != lVar12);
  }
  sVar2 = ((this->name_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar4 = (uint)sVar2 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar6 = sVar6 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  if (this->source_context_ != (SourceContext *)0x0 && this != (Type *)_Type_default_instance_) {
    sVar8 = SourceContext::ByteSizeLong(this->source_context_);
    uVar4 = (uint)sVar8 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar6 = sVar6 + sVar8 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  uVar4 = this->syntax_;
  if (uVar4 != 0) {
    if ((int)uVar4 < 0) {
      uVar9 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar9 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    sVar6 = sVar6 + uVar9;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar6;
    return sVar6;
  }
  sVar6 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar6,
                     &this->_cached_size_);
  return sVar6;
}

Assistant:

size_t Type::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.Type)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.Field fields = 2;
  total_size += 1UL * this->_internal_fields_size();
  for (const auto& msg : this->fields_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string oneofs = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(oneofs_.size());
  for (int i = 0, n = oneofs_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      oneofs_.Get(i));
  }

  // repeated .google.protobuf.Option options = 4;
  total_size += 1UL * this->_internal_options_size();
  for (const auto& msg : this->options_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());
  }

  // .google.protobuf.SourceContext source_context = 5;
  if (this->has_source_context()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *source_context_);
  }

  // .google.protobuf.Syntax syntax = 6;
  if (this->syntax() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_syntax());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}